

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O0

shared_ptr<const_helics::SmallBuffer> * __thiscall
helics::InputInfo::getData(InputInfo *this,int index)

{
  bool bVar1;
  int in_ESI;
  long in_RDI;
  vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
  *in_stack_ffffffffffffffd8;
  const_reference local_8;
  
  bVar1 = isValidIndex<int,std::vector<std::shared_ptr<helics::SmallBuffer_const>,std::allocator<std::shared_ptr<helics::SmallBuffer_const>>>>
                    ((int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffd8);
  if (bVar1) {
    local_8 = std::
              vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
              ::operator[]((vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
                            *)(in_RDI + 0x98),(long)in_ESI);
  }
  else {
    local_8 = (const_reference)NullData;
  }
  return local_8;
}

Assistant:

const std::shared_ptr<const SmallBuffer>& InputInfo::getData(int index) const
{
    if (isValidIndex(index, current_data)) {
        return current_data[index];
    }
    return NullData;
}